

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

void Saig_ManDemiterMarkPos(Aig_Man_t *p)

{
  ulong *puVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  Aig_ManCleanMarkAB(p);
  iVar6 = p->nRegs;
  if (0 < iVar6) {
    iVar4 = 0;
    do {
      uVar9 = p->nTruePis + iVar4;
      if (((int)uVar9 < 0) || (p->vCis->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((long)p->vCis->pArray[uVar9] + 0x18);
      *puVar1 = *puVar1 | (ulong)(iVar6 / 2 <= iVar4) * 0x10 + 0x10;
      iVar4 = iVar4 + 1;
      iVar6 = p->nRegs;
    } while (iVar4 < iVar6);
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar5];
      if ((pvVar2 != (void *)0x0) &&
         (uVar3 = *(ulong *)((long)pvVar2 + 0x18), 0xfffffffd < ((uint)uVar3 & 7) - 7)) {
        uVar7 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        uVar10 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        uVar11 = (ulong)((*(uint *)(uVar10 + 0x18) | *(uint *)(uVar7 + 0x18)) & 0x10);
        *(ulong *)((long)pvVar2 + 0x18) = uVar3 & 0xffffffffffffffef | uVar11;
        *(ulong *)((long)pvVar2 + 0x18) =
             uVar3 & 0xffffffffffffffcf | uVar11 |
             (ulong)((*(uint *)(uVar10 + 0x18) | *(uint *)(uVar7 + 0x18)) & 0x20);
        pVVar8 = p->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Saig_ManDemiterMarkPos( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkAB( p );
    Saig_ManForEachLo( p, pObj, i )
        if ( i < Saig_ManRegNum(p)/2 )
            pObj->fMarkA = 1;
        else
            pObj->fMarkB = 1;
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->fMarkA = Aig_ObjFanin0(pObj)->fMarkA | Aig_ObjFanin1(pObj)->fMarkA;
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB | Aig_ObjFanin1(pObj)->fMarkB;
    }
}